

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O3

int __thiscall ncnn::Convolution_x86::create_pipeline(Convolution_x86 *this,Option *opt)

{
  Mat *this_00;
  uint num_output;
  int iVar1;
  int *piVar2;
  size_t sVar3;
  size_t sVar4;
  undefined8 uVar5;
  void *pvVar6;
  long *plVar7;
  _func_int *p_Var8;
  undefined8 uVar9;
  bool bVar10;
  bool bVar11;
  byte bVar12;
  uint num_input;
  int iVar13;
  int iVar14;
  _func_int **pp_Var15;
  Layer *pLVar16;
  byte bVar17;
  int iVar18;
  uint uVar19;
  _func_int **pp_Var20;
  ulong uVar21;
  long lVar22;
  byte bVar23;
  int k_3;
  uint uVar24;
  int iVar25;
  int iVar26;
  long lVar27;
  ulong uVar28;
  undefined4 *puVar29;
  uint uVar30;
  undefined4 *puVar31;
  long lVar32;
  _func_int *p_Var33;
  long lVar34;
  int k;
  ulong uVar35;
  long lVar36;
  uint _w;
  int iVar37;
  ulong uVar38;
  long lVar39;
  long lVar40;
  undefined4 *puVar41;
  long lVar42;
  long lVar43;
  long lVar44;
  _func_int **pp_Var45;
  ulong uVar46;
  long lVar47;
  int k_2;
  long lVar48;
  long lVar49;
  long lVar50;
  long lVar51;
  _func_int **pp_Var52;
  _func_int **pp_Var53;
  long lVar54;
  undefined4 *puVar55;
  _func_int *p_Var56;
  long lVar57;
  long lVar58;
  ulong local_1f8;
  ParamDict pd_6;
  ParamDict pd;
  undefined4 local_198;
  undefined4 uStack_194;
  int local_190;
  Allocator *local_188;
  int iStack_180;
  int iStack_17c;
  int iStack_178;
  int iStack_174;
  int local_170 [2];
  size_t local_168 [2];
  undefined4 uStack_158;
  undefined4 uStack_154;
  undefined4 local_150;
  undefined4 uStack_14c;
  undefined4 local_148;
  undefined8 local_140;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 local_128;
  undefined8 local_120;
  ulong local_110;
  long local_108;
  long local_100;
  long local_f8;
  long local_f0;
  ParamDict pd_5;
  ModelBinFromMatArray local_50;
  _func_int *local_40;
  ulong local_38;
  
  pp_Var15 = this->_vptr_Convolution_x86;
  p_Var33 = pp_Var15[-3];
  if (*(int *)((long)&(this->weight_winograd63_data).allocator + (long)p_Var33) != 0) {
    return 0;
  }
  switch(*(undefined4 *)(&(this->weight_winograd43_data).field_0x1c + (long)p_Var33)) {
  case 1:
    pLVar16 = create_layer(0x1a);
    ParamDict::ParamDict(&pd);
    (*pLVar16->_vptr_Layer[2])(pLVar16,&pd);
    break;
  case 2:
    pLVar16 = create_layer(0x1a);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,**(float **)
                           ((long)&(this->weight_winograd43_data).allocator + (long)p_Var33));
    (*pLVar16->_vptr_Layer[2])(pLVar16,&pd);
    goto LAB_001ac469;
  case 3:
    pLVar16 = create_layer(0x36);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,**(float **)
                           ((long)&(this->weight_winograd43_data).allocator + (long)p_Var33));
    ParamDict::set(&pd,1,*(float *)(*(long *)((long)&(this->weight_winograd43_data).allocator +
                                             (long)p_Var33) + 4));
    (*pLVar16->_vptr_Layer[2])(pLVar16,&pd);
    goto LAB_001ac469;
  case 4:
    pLVar16 = create_layer(0x1e);
    ParamDict::ParamDict(&pd);
    (*pLVar16->_vptr_Layer[2])(pLVar16,&pd);
    break;
  case 5:
    pLVar16 = create_layer(0x47);
    ParamDict::ParamDict(&pd);
    (*pLVar16->_vptr_Layer[2])(pLVar16,&pd);
    break;
  case 6:
    pLVar16 = create_layer(0x43);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,**(float **)
                           ((long)&(this->weight_winograd43_data).allocator + (long)p_Var33));
    ParamDict::set(&pd,1,*(float *)(*(long *)((long)&(this->weight_winograd43_data).allocator +
                                             (long)p_Var33) + 4));
    (*pLVar16->_vptr_Layer[2])(pLVar16,&pd);
LAB_001ac469:
    ParamDict::~ParamDict(&pd);
    goto LAB_001ac478;
  default:
    pLVar16 = (Layer *)0x0;
    goto LAB_001ac488;
  }
  ParamDict::~ParamDict(&pd);
LAB_001ac478:
  (*pLVar16->_vptr_Layer[4])(pLVar16,opt);
  pp_Var15 = this->_vptr_Convolution_x86;
LAB_001ac488:
  this->activation = pLVar16;
  this->nT = opt->num_threads;
  p_Var33 = pp_Var15[-3];
  if ((opt->use_int8_inference == true) &&
     (*(long *)((long)&(this->weight_winograd63_data).c + (long)p_Var33) == 1)) {
    create_pipeline_int8_x86(this,opt);
    return 0;
  }
  uVar30 = *(uint *)((long)&(this->weight_winograd23_data).dims + (long)p_Var33);
  iVar26 = *(int *)((long)&(this->weight_winograd23_data).w + (long)p_Var33);
  iVar18 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var33);
  uVar38 = (long)*(int *)((long)&(this->weight_winograd43_data).elemsize + (long)(p_Var33 + 4)) /
           (long)(iVar18 * iVar26);
  uVar38 = (long)((ulong)(uint)((int)uVar38 >> 0x1f) << 0x20 | uVar38 & 0xffffffff) /
           (long)(int)uVar30;
  bVar10 = opt->use_packing_layout;
  if ((((iVar26 == iVar18 && bVar10 == false) &&
       (iVar14 = *(int *)((long)&(this->weight_winograd23_data).d + (long)p_Var33), iVar14 != 1)) &&
      (*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var33) == iVar14)) &&
     ((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var33) == 1 &&
      (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var33) == 1)))) {
    pLVar16 = create_layer(6);
    this->convolution_dilation1 = pLVar16;
    ParamDict::ParamDict(&pd_5);
    ParamDict::set(&pd_5,0,*(int *)((long)&(this->weight_winograd23_data).dims +
                                   (long)this->_vptr_Convolution_x86[-3]));
    ParamDict::set(&pd_5,1,*(int *)((long)&(this->weight_winograd23_data).w +
                                   (long)this->_vptr_Convolution_x86[-3]));
    ParamDict::set(&pd_5,0xb,
                   *(int *)((long)&(this->weight_winograd23_data).h +
                           (long)this->_vptr_Convolution_x86[-3]));
    ParamDict::set(&pd_5,2,1);
    ParamDict::set(&pd_5,0xc,1);
    ParamDict::set(&pd_5,3,1);
    ParamDict::set(&pd_5,0xd,1);
    ParamDict::set(&pd_5,4,0);
    ParamDict::set(&pd_5,0xe,0);
    ParamDict::set(&pd_5,5,*(int *)((long)&(this->weight_winograd43_data).elemsize +
                                   (long)this->_vptr_Convolution_x86[-3]));
    ParamDict::set(&pd_5,6,*(int *)((long)&(this->weight_winograd43_data).elemsize +
                                   (long)(this->_vptr_Convolution_x86[-3] + 4)));
    (*this->convolution_dilation1->_vptr_Layer[2])(this->convolution_dilation1,&pd_5);
    pp_Var15 = this->_vptr_Convolution_x86;
    if (*(int *)((long)&(this->weight_winograd43_data).elemsize + (long)pp_Var15[-3]) == 0) {
      local_168[0] = 0;
      pd._vptr_ParamDict = (_func_int **)0x0;
      pd.d._0_4_ = 0;
      pd.d._4_4_ = 0;
      uStack_194 = 0;
      local_190 = 0;
      local_188 = (Allocator *)0x0;
      iStack_180 = 0;
      iStack_17c = 0;
      iStack_178 = 0;
      iStack_174 = 0;
      local_170[0] = 0;
      p_Var33 = pp_Var15[-3];
      if (&pd != (ParamDict *)((long)&(this->weight_winograd63_data).dims + (long)p_Var33)) {
        piVar2 = *(int **)((long)&(this->weight_winograd63_data).h + (long)p_Var33);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + 1;
          UNLOCK();
        }
        pd._vptr_ParamDict =
             *(_func_int ***)((long)&(this->weight_winograd63_data).dims + (long)p_Var33);
        uVar5 = *(undefined8 *)((long)&(this->weight_winograd63_data).h + (long)p_Var33);
        pd.d._0_4_ = (undefined4)uVar5;
        pd.d._4_4_ = (undefined4)((ulong)uVar5 >> 0x20);
        uStack_194 = (undefined4)
                     ((ulong)*(undefined8 *)
                              ((long)&(this->weight_winograd63_data).c + (long)p_Var33) >> 0x20);
        local_190 = *(int *)((long)&(this->weight_winograd63_data).cstep + (long)p_Var33);
        local_188 = *(Allocator **)((long)&this->convolution_dilation1 + (long)p_Var33);
        uVar5 = *(undefined8 *)((long)&this->gemm + (long)p_Var33);
        uVar9 = *(undefined8 *)((long)&(this->scale_in_data).data + (long)p_Var33);
        iStack_180 = (int)uVar5;
        iStack_17c = (int)((ulong)uVar5 >> 0x20);
        iStack_178 = (int)uVar9;
        iStack_174 = (int)((ulong)uVar9 >> 0x20);
        local_170[0] = *(int *)((long)&(this->scale_in_data).refcount + (long)p_Var33);
        local_168[0] = *(size_t *)((long)&(this->scale_in_data).elemsize + (long)p_Var33);
      }
      pLVar16 = this->convolution_dilation1;
      ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&pd_6,(Mat *)&pd);
      (*pLVar16->_vptr_Layer[3])(pLVar16,&pd_6);
      ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&pd_6);
      piVar2 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (local_188 == (Allocator *)0x0) {
            if (pd._vptr_ParamDict != (_func_int **)0x0) {
              free(pd._vptr_ParamDict);
            }
          }
          else {
            (*local_188->_vptr_Allocator[3])();
          }
        }
      }
    }
    else {
      local_168[0] = 0;
      pd._vptr_ParamDict = (_func_int **)0x0;
      pd.d._0_4_ = 0;
      pd.d._4_4_ = 0;
      uStack_194 = 0;
      local_190 = 0;
      local_188 = (Allocator *)0x0;
      iStack_180 = 0;
      iStack_17c = 0;
      iStack_178 = 0;
      iStack_174 = 0;
      local_170[0] = 0;
      p_Var33 = pp_Var15[-3];
      if (&pd != (ParamDict *)((long)&(this->weight_winograd63_data).dims + (long)p_Var33)) {
        piVar2 = *(int **)((long)&(this->weight_winograd63_data).h + (long)p_Var33);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + 1;
          UNLOCK();
        }
        pd._vptr_ParamDict =
             *(_func_int ***)((long)&(this->weight_winograd63_data).dims + (long)p_Var33);
        uVar5 = *(undefined8 *)((long)&(this->weight_winograd63_data).h + (long)p_Var33);
        pd.d._0_4_ = (undefined4)uVar5;
        pd.d._4_4_ = (undefined4)((ulong)uVar5 >> 0x20);
        uStack_194 = (undefined4)
                     ((ulong)*(undefined8 *)
                              ((long)&(this->weight_winograd63_data).c + (long)p_Var33) >> 0x20);
        local_190 = *(int *)((long)&(this->weight_winograd63_data).cstep + (long)p_Var33);
        local_188 = *(Allocator **)((long)&this->convolution_dilation1 + (long)p_Var33);
        iStack_180 = *(int *)((long)&this->gemm + (long)p_Var33);
        iStack_17c = *(int *)((long)&this->gemm + (long)(p_Var33 + 4));
        iStack_178 = *(int *)((long)&(this->scale_in_data).data + (long)p_Var33);
        iStack_174 = *(int *)((long)&(this->scale_in_data).data + (long)(p_Var33 + 4));
        local_170[0] = *(int *)((long)&(this->scale_in_data).refcount + (long)p_Var33);
        local_168[0] = *(size_t *)((long)&(this->scale_in_data).elemsize + (long)p_Var33);
        p_Var33 = this->_vptr_Convolution_x86[-3];
      }
      local_120 = 0;
      local_128 = 0;
      uStack_12c = 0;
      uStack_130 = 0;
      uStack_134 = 0;
      uStack_138 = 0;
      local_140 = 0;
      local_148 = 0;
      uStack_14c = 0;
      local_150 = 0;
      uStack_154 = 0;
      uStack_158 = 0;
      local_168[1] = 0;
      if ((_func_int *)(local_168 + 1) !=
          (_func_int *)((long)&(this->scale_in_data).elempack + (long)p_Var33)) {
        piVar2 = *(int **)((long)&(this->scale_in_data).allocator + (long)p_Var33);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + 1;
          UNLOCK();
        }
        local_168[1] = *(size_t *)((long)&(this->scale_in_data).elempack + (long)p_Var33);
        uVar5 = *(undefined8 *)((long)&(this->scale_in_data).allocator + (long)p_Var33);
        uStack_158 = (undefined4)uVar5;
        uStack_154 = (undefined4)((ulong)uVar5 >> 0x20);
        uVar5 = *(undefined8 *)((long)&(this->scale_in_data).dims + (long)p_Var33);
        local_150 = (undefined4)uVar5;
        uStack_14c = (undefined4)((ulong)uVar5 >> 0x20);
        local_148 = *(undefined4 *)((long)&(this->scale_in_data).h + (long)p_Var33);
        local_140 = *(undefined8 *)((long)&(this->scale_in_data).c + (long)p_Var33);
        uVar5 = *(undefined8 *)((long)&(this->scale_in_data).cstep + (long)p_Var33);
        uStack_138 = (undefined4)uVar5;
        uStack_134 = (undefined4)((ulong)uVar5 >> 0x20);
        uStack_130 = (undefined4)*(undefined8 *)(&this->field_0x1d8 + (long)p_Var33);
        uStack_12c = (undefined4)
                     ((ulong)*(undefined8 *)(&this->field_0x1d8 + (long)p_Var33) >> 0x20);
        local_128 = *(undefined4 *)(&this->field_0x1e0 + (long)p_Var33);
        local_120 = *(undefined8 *)(&this->field_0x1e8 + (long)p_Var33);
      }
      pLVar16 = this->convolution_dilation1;
      ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&pd_6,(Mat *)&pd);
      (*pLVar16->_vptr_Layer[3])(pLVar16,&pd_6);
      ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&pd_6);
      lVar34 = 0x48;
      do {
        piVar2 = *(int **)((long)&pd.d + lVar34);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            pvVar6 = *(void **)((long)&pd._vptr_ParamDict + lVar34);
            if (*(long **)((long)&local_188 + lVar34) == (long *)0x0) {
              if (pvVar6 != (void *)0x0) {
                free(pvVar6);
              }
            }
            else {
              (**(code **)(**(long **)((long)&local_188 + lVar34) + 0x18))();
            }
          }
        }
        *(undefined8 *)((long)local_168 + lVar34) = 0;
        *(undefined8 *)((long)&pd.d + lVar34 + 4) = 0;
        *(undefined8 *)((long)&uStack_194 + lVar34) = 0;
        *(undefined8 *)((long)&pd._vptr_ParamDict + lVar34) = 0;
        *(undefined8 *)((long)&pd.d + lVar34) = 0;
        *(undefined8 *)((long)&iStack_180 + lVar34) = 0;
        *(undefined8 *)((long)&iStack_178 + lVar34) = 0;
        *(undefined4 *)((long)local_170 + lVar34) = 0;
        lVar34 = lVar34 + -0x48;
      } while (lVar34 != -0x48);
    }
    (*this->convolution_dilation1->_vptr_Layer[4])(this->convolution_dilation1,opt);
    if (opt->lightmode == true) {
      p_Var33 = this->_vptr_Convolution_x86[-3];
      piVar2 = *(int **)((long)&(this->weight_winograd63_data).h + (long)p_Var33);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          pvVar6 = *(void **)((long)&(this->weight_winograd63_data).dims + (long)p_Var33);
          plVar7 = *(long **)((long)&this->convolution_dilation1 + (long)p_Var33);
          if (plVar7 == (long *)0x0) {
            if (pvVar6 != (void *)0x0) {
              free(pvVar6);
            }
          }
          else {
            (**(code **)(*plVar7 + 0x18))();
          }
        }
      }
      *(undefined8 *)((long)&(this->scale_in_data).elemsize + (long)p_Var33) = 0;
      *(undefined8 *)((long)&(this->weight_winograd63_data).d + (long)p_Var33) = 0;
      *(undefined8 *)(&(this->weight_winograd63_data).field_0x3c + (long)p_Var33) = 0;
      *(undefined8 *)((long)&(this->weight_winograd63_data).dims + (long)p_Var33) = 0;
      *(undefined8 *)((long)&(this->weight_winograd63_data).h + (long)p_Var33) = 0;
      *(undefined8 *)((long)&this->gemm + (long)p_Var33) = 0;
      *(undefined8 *)((long)&(this->scale_in_data).data + (long)p_Var33) = 0;
      *(undefined4 *)((long)&(this->scale_in_data).refcount + (long)p_Var33) = 0;
    }
    ParamDict::~ParamDict(&pd_5);
    return 0;
  }
  num_input = (uint)uVar38;
  if (bVar10 == false) {
    local_1f8 = 1;
  }
  else {
    local_1f8 = (ulong)((uint)((uVar38 & 3) == 0) * 3 + 1);
  }
  bVar23 = opt->use_winograd23_convolution;
  if ((((bool)bVar23 == false) && (opt->use_winograd43_convolution == false)) &&
     (opt->use_winograd63_convolution != true)) {
LAB_001ac821:
    iVar13 = get_cpu_level2_cache_size();
    p_Var33 = this->_vptr_Convolution_x86[-3];
    num_output = *(uint *)((long)&(this->weight_winograd23_data).dims + (long)p_Var33);
    iVar26 = *(int *)((long)&(this->weight_winograd23_data).w + (long)p_Var33);
    iVar18 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var33);
    iVar14 = *(int *)((long)&(this->weight_winograd23_data).d + (long)p_Var33);
    iVar25 = *(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var33);
    iVar37 = *(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var33);
    iVar1 = *(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var33);
    if ((opt->use_sgemm_convolution == true) &&
       (iVar13 < (int)(num_output * iVar26 * iVar18 * iVar14 * iVar25 * iVar37 * iVar1 * num_input *
                      8) || (0x10 < (int)num_input || 0x10 < (int)num_output))) {
LAB_001ac8b9:
      pLVar16 = create_layer(0x4a);
      this->gemm = pLVar16;
      ParamDict::ParamDict(&pd_6);
      ParamDict::set(&pd_6,2,0);
      ParamDict::set(&pd_6,3,0);
      ParamDict::set(&pd_6,4,1);
      ParamDict::set(&pd_6,5,0);
      ParamDict::set(&pd_6,6,1);
      ParamDict::set(&pd_6,7,*(int *)((long)&(this->weight_winograd23_data).dims +
                                     (long)this->_vptr_Convolution_x86[-3]));
      ParamDict::set(&pd_6,8,0);
      uVar30 = iVar18 * iVar26;
      ParamDict::set(&pd_6,9,uVar30 * num_input);
      ParamDict::set(&pd_6,10,-(uint)(*(int *)((long)&(this->weight_winograd43_data).elemsize +
                                              (long)this->_vptr_Convolution_x86[-3]) == 0) | 1);
      ParamDict::set(&pd_6,0xb,1);
      (*this->gemm->_vptr_Layer[2])(this->gemm,&pd_6);
      pd_5._vptr_ParamDict = (_func_int **)0x0;
      pd_5.d._0_4_ = 0;
      pd_5.d._4_4_ = 0;
      this_00 = (Mat *)((long)&(this->weight_winograd63_data).dims +
                       (long)this->_vptr_Convolution_x86[-3]);
      Mat::reshape((Mat *)&pd,this_00,uVar30,num_input,*(int *)&this_00[-2].data,(Allocator *)0x0);
      Mat::create((Mat *)&pd_5,uVar30 * num_input,
                  *(int *)((long)&(this->weight_winograd23_data).dims +
                          (long)this->_vptr_Convolution_x86[-3]),4,(Allocator *)0x0);
      pp_Var15 = this->_vptr_Convolution_x86;
      p_Var33 = pp_Var15[-3];
      if (0 < *(int *)((long)&(this->weight_winograd23_data).dims + (long)p_Var33)) {
        lVar34 = 0;
        do {
          if ((int)local_1f8 <= (int)num_input) {
            lVar48 = (long)iStack_17c * CONCAT44(uStack_194,local_198);
            pp_Var20 = (_func_int **)
                       (CONCAT44(uStack_194,local_198) * local_168[0] * lVar34 +
                       (long)pd._vptr_ParamDict);
            lVar50 = 0;
            pp_Var45 = pd_5._vptr_ParamDict;
            do {
              if (0 < (int)uVar30) {
                uVar35 = 0;
                uVar38 = local_1f8;
                pp_Var53 = pp_Var20;
                pp_Var52 = pp_Var20;
                do {
                  do {
                    *(undefined4 *)pp_Var45 = *(undefined4 *)pp_Var53;
                    pp_Var45 = (_func_int **)((long)pp_Var45 + 4);
                    uVar38 = uVar38 - 1;
                    pp_Var53 = (_func_int **)((long)pp_Var53 + lVar48);
                  } while (uVar38 != 0);
                  uVar35 = uVar35 + 1;
                  pp_Var53 = (_func_int **)((long)pp_Var52 + 4);
                  uVar38 = local_1f8;
                  pp_Var52 = pp_Var53;
                } while (uVar35 != uVar30);
              }
              lVar50 = lVar50 + local_1f8;
              pp_Var20 = (_func_int **)((long)pp_Var20 + lVar48 * local_1f8);
            } while (lVar50 < (long)((long)(int)num_input - (ulong)((int)local_1f8 - 1)));
            p_Var33 = pp_Var15[-3];
          }
          lVar34 = lVar34 + 1;
        } while (lVar34 < *(int *)((long)&(this->weight_winograd23_data).dims + (long)p_Var33));
      }
      piVar2 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (local_188 == (Allocator *)0x0) {
            if (pd._vptr_ParamDict != (_func_int **)0x0) {
              free(pd._vptr_ParamDict);
            }
          }
          else {
            (*local_188->_vptr_Allocator[3])();
          }
        }
      }
      if (*(int *)((long)&(this->weight_winograd43_data).elemsize +
                  (long)this->_vptr_Convolution_x86[-3]) == 0) {
        piVar2 = (int *)CONCAT44(pd_5.d._4_4_,pd_5.d._0_4_);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + 1;
          UNLOCK();
        }
        pd._vptr_ParamDict = pd_5._vptr_ParamDict;
        pd.d._0_4_ = pd_5.d._0_4_;
        pd.d._4_4_ = pd_5.d._4_4_;
        uStack_194 = 0;
        local_190 = 0;
        local_188 = (Allocator *)0x0;
        iStack_180 = 0;
        iStack_17c = 0;
        iStack_178 = 0;
        iStack_174 = 0;
        local_170[0] = 0;
        local_168[0] = 0;
        pLVar16 = this->gemm;
        ModelBinFromMatArray::ModelBinFromMatArray(&local_50,(Mat *)&pd);
        (*pLVar16->_vptr_Layer[3])(pLVar16,&local_50);
        ModelBinFromMatArray::~ModelBinFromMatArray(&local_50);
        piVar2 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            if (local_188 == (Allocator *)0x0) {
              if (pd._vptr_ParamDict != (_func_int **)0x0) {
                free(pd._vptr_ParamDict);
              }
            }
            else {
              (*local_188->_vptr_Allocator[3])();
            }
          }
        }
      }
      else {
        piVar2 = (int *)CONCAT44(pd_5.d._4_4_,pd_5.d._0_4_);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + 1;
          UNLOCK();
        }
        local_120 = 0;
        local_128 = 0;
        uStack_12c = 0;
        uStack_130 = 0;
        uStack_134 = 0;
        uStack_138 = 0;
        local_140 = 0;
        local_148 = 0;
        uStack_14c = 0;
        local_150 = 0;
        uStack_154 = 0;
        uStack_158 = 0;
        local_168[1] = 0;
        p_Var33 = this->_vptr_Convolution_x86[-3];
        if ((_func_int *)(local_168 + 1) !=
            (_func_int *)((long)&(this->scale_in_data).elempack + (long)p_Var33)) {
          piVar2 = *(int **)((long)&(this->scale_in_data).allocator + (long)p_Var33);
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + 1;
            UNLOCK();
          }
          local_168[1] = *(size_t *)((long)&(this->scale_in_data).elempack + (long)p_Var33);
          uVar5 = *(undefined8 *)((long)&(this->scale_in_data).allocator + (long)p_Var33);
          uStack_158 = (undefined4)uVar5;
          uStack_154 = (undefined4)((ulong)uVar5 >> 0x20);
          uVar5 = *(undefined8 *)((long)&(this->scale_in_data).dims + (long)p_Var33);
          local_150 = (undefined4)uVar5;
          uStack_14c = (undefined4)((ulong)uVar5 >> 0x20);
          local_148 = *(undefined4 *)((long)&(this->scale_in_data).h + (long)p_Var33);
          local_140 = *(undefined8 *)((long)&(this->scale_in_data).c + (long)p_Var33);
          uVar5 = *(undefined8 *)((long)&(this->scale_in_data).cstep + (long)p_Var33);
          uStack_138 = (undefined4)uVar5;
          uStack_134 = (undefined4)((ulong)uVar5 >> 0x20);
          uStack_130 = (undefined4)*(undefined8 *)(&this->field_0x1d8 + (long)p_Var33);
          uStack_12c = (undefined4)
                       ((ulong)*(undefined8 *)(&this->field_0x1d8 + (long)p_Var33) >> 0x20);
          local_128 = *(undefined4 *)(&this->field_0x1e0 + (long)p_Var33);
          local_120 = *(undefined8 *)(&this->field_0x1e8 + (long)p_Var33);
        }
        local_168[0] = 0;
        local_170[0] = 0;
        iStack_174 = 0;
        iStack_178 = 0;
        iStack_17c = 0;
        iStack_180 = 0;
        local_188 = (Allocator *)0x0;
        local_190 = 0;
        uStack_194 = 0;
        pd.d._4_4_ = pd_5.d._4_4_;
        pd.d._0_4_ = pd_5.d._0_4_;
        pd._vptr_ParamDict = pd_5._vptr_ParamDict;
        pLVar16 = this->gemm;
        ModelBinFromMatArray::ModelBinFromMatArray(&local_50,(Mat *)&pd);
        (*pLVar16->_vptr_Layer[3])(pLVar16,&local_50);
        ModelBinFromMatArray::~ModelBinFromMatArray(&local_50);
        lVar34 = 0x48;
        do {
          piVar2 = *(int **)((long)&pd.d + lVar34);
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              pvVar6 = *(void **)((long)&pd._vptr_ParamDict + lVar34);
              if (*(long **)((long)&local_188 + lVar34) == (long *)0x0) {
                if (pvVar6 != (void *)0x0) {
                  free(pvVar6);
                }
              }
              else {
                (**(code **)(**(long **)((long)&local_188 + lVar34) + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)local_168 + lVar34) = 0;
          *(undefined8 *)((long)&pd.d + lVar34 + 4) = 0;
          *(undefined8 *)((long)&uStack_194 + lVar34) = 0;
          *(undefined8 *)((long)&pd._vptr_ParamDict + lVar34) = 0;
          *(undefined8 *)((long)&pd.d + lVar34) = 0;
          *(undefined8 *)((long)&iStack_180 + lVar34) = 0;
          *(undefined8 *)((long)&iStack_178 + lVar34) = 0;
          *(undefined4 *)((long)local_170 + lVar34) = 0;
          lVar34 = lVar34 + -0x48;
        } while (lVar34 != -0x48);
      }
      (*this->gemm->_vptr_Layer[4])(this->gemm,opt);
      piVar2 = (int *)CONCAT44(pd_5.d._4_4_,pd_5.d._0_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if ((*piVar2 == 0) && (pd_5._vptr_ParamDict != (_func_int **)0x0)) {
          free(pd_5._vptr_ParamDict);
        }
      }
      ParamDict::~ParamDict(&pd_6);
    }
    else {
      p_Var33 = (_func_int *)((long)&this->_vptr_Convolution_x86 + (long)p_Var33);
      if (iVar26 == 1) {
        if (iVar18 != 1) goto LAB_001ace41;
        goto LAB_001ac8b9;
      }
      if (((((bVar10 == false || (uVar30 & 3) != 0) || (int)local_1f8 != 1) || (iVar26 != 3)) ||
          (iVar18 != 3)) || ((iVar14 != 1 || (iVar25 != 1)))) {
LAB_001ace41:
        uVar30 = iVar18 * iVar26;
        lVar34 = (long)(int)uVar30;
        lVar48 = (long)(int)num_input;
        uVar35 = (ulong)uVar30;
        uVar38 = uVar38 & 0xffffffff;
        local_40 = p_Var33;
        if ((int)num_output < 4) {
          uVar24 = num_input;
          if ((int)num_output < 2) {
            uVar19 = num_output;
            if ((int)num_input < 4) {
              _w = uVar30;
              if (1 < (int)num_input) {
                uVar24 = (num_input & 1) + 1;
                _w = uVar30 * 2;
              }
            }
            else {
              uVar24 = (num_input & 1) + (num_input >> 2) + (uint)((num_input >> 1 & 1) != 0);
              _w = uVar30 * 4;
            }
          }
          else if ((int)num_input < 4) {
            if ((int)num_input < 2) {
              _w = uVar30 * 2;
            }
            else {
              _w = uVar30 * 4;
              uVar24 = (num_input & 1) + 1;
            }
            uVar19 = (num_output & 1) + 1;
          }
          else {
            uVar24 = (num_input & 1) + (num_input >> 2) + (uint)((num_input >> 1 & 1) != 0);
            _w = uVar30 * 8;
            uVar19 = (num_output & 1) + 1;
          }
          uVar46 = 0;
          Mat::create(&this->weight_data_tm,_w,uVar24,uVar19,4,(Allocator *)0x0);
        }
        else {
          if ((int)num_input < 4) {
            if (1 < (int)num_input) {
              iVar26 = uVar30 * 8;
              uVar24 = (num_input & 1) + 1;
              goto LAB_001acf04;
            }
            iVar26 = uVar30 * 4;
            iVar18 = (num_output & 1) + (num_output >> 2) + (uint)((num_output >> 1 & 1) != 0);
            uVar24 = num_input;
          }
          else {
            iVar26 = uVar30 * 0x10;
            uVar24 = (num_input & 1) + (num_input >> 2) + (uint)((num_input >> 1 & 1) != 0);
LAB_001acf04:
            iVar18 = (num_output & 1) + (num_output >> 2) + (uint)((num_output >> 1 & 1) != 0);
          }
          Mat::create(&this->weight_data_tm,iVar26,uVar24,iVar18,4,(Allocator *)0x0);
          local_108 = *(long *)(p_Var33 + 0x160);
          iVar25 = uVar30 * num_input;
          pvVar6 = (this->weight_data_tm).data;
          sVar3 = (this->weight_data_tm).elemsize;
          sVar4 = (this->weight_data_tm).cstep;
          iVar14 = uVar30 * num_input;
          iVar26 = iVar14 * 4;
          local_f0 = uVar35 * 0x10;
          lVar50 = lVar34 * 4;
          iVar18 = iVar14 * 3;
          iVar14 = iVar14 * 2;
          local_110 = lVar34 * 8;
          iVar37 = 0;
          uVar28 = 0;
          do {
            local_f8 = CONCAT44(local_f8._4_4_,iVar25);
            lVar36 = (long)iVar37;
            puVar31 = (undefined4 *)((uVar28 >> 2) * sVar3 * sVar4 + (long)pvVar6);
            if ((int)num_input < 4) {
              uVar46 = 0;
            }
            else {
              lVar42 = local_108 + lVar36 * 4;
              lVar47 = local_108 + (long)iVar25 * 4;
              lVar54 = local_108 + (long)iVar14 * 4;
              lVar51 = local_108 + (long)iVar18 * 4;
              uVar21 = 0;
              do {
                if (0 < (int)uVar30) {
                  uVar46 = 0;
                  lVar27 = lVar51;
                  lVar39 = lVar54;
                  lVar44 = lVar47;
                  lVar57 = lVar42;
                  do {
                    puVar55 = puVar31;
                    lVar32 = 0;
                    lVar49 = 0;
                    do {
                      *(undefined4 *)((long)puVar55 + lVar49) = *(undefined4 *)(lVar57 + lVar32);
                      *(undefined4 *)((long)puVar55 + lVar49 + 4) = *(undefined4 *)(lVar44 + lVar32)
                      ;
                      *(undefined4 *)((long)puVar55 + lVar49 + 8) = *(undefined4 *)(lVar39 + lVar32)
                      ;
                      *(undefined4 *)((long)puVar55 + lVar49 + 0xc) =
                           *(undefined4 *)(lVar27 + lVar32);
                      lVar49 = lVar49 + 0x10;
                      lVar32 = lVar32 + lVar50;
                    } while ((int)lVar49 != 0x40);
                    uVar46 = uVar46 + 1;
                    lVar57 = lVar57 + 4;
                    lVar44 = lVar44 + 4;
                    lVar39 = lVar39 + 4;
                    lVar27 = lVar27 + 4;
                    puVar31 = (undefined4 *)((long)puVar55 + lVar49);
                  } while (uVar46 != uVar35);
                  puVar31 = (undefined4 *)((long)puVar55 + lVar49);
                }
                uVar46 = uVar21 + 4;
                lVar27 = uVar21 + 7;
                lVar42 = lVar42 + local_f0;
                lVar47 = lVar47 + local_f0;
                lVar54 = lVar54 + local_f0;
                lVar51 = lVar51 + local_f0;
                uVar21 = uVar46;
                local_100 = lVar36;
              } while (lVar27 < lVar48);
            }
            lVar54 = (long)iVar18 * 4;
            lVar42 = (long)iVar14 * 4;
            lVar47 = (long)iVar25 * 4;
            lVar36 = lVar36 * 4;
            if ((int)((uint)uVar46 | 1) < (int)num_input) {
              lVar44 = lVar50 * (uVar46 & 0xffffffff);
              lVar27 = lVar36 + lVar44 + local_108;
              lVar51 = lVar44 + lVar54 + local_108;
              lVar39 = lVar44 + lVar42 + local_108;
              lVar44 = lVar44 + lVar47 + local_108;
              uVar21 = uVar46 & 0xffffffff;
              do {
                if (0 < (int)uVar30) {
                  uVar46 = 0;
                  lVar57 = lVar27;
                  lVar32 = lVar51;
                  lVar49 = lVar39;
                  lVar58 = lVar44;
                  do {
                    lVar43 = 0;
                    bVar10 = true;
                    do {
                      bVar11 = bVar10;
                      *puVar31 = *(undefined4 *)(lVar57 + lVar43);
                      puVar31[1] = *(undefined4 *)(lVar58 + lVar43);
                      puVar31[2] = *(undefined4 *)(lVar49 + lVar43);
                      puVar31[3] = *(undefined4 *)(lVar32 + lVar43);
                      puVar31 = puVar31 + 4;
                      lVar43 = lVar43 + lVar50;
                      bVar10 = false;
                    } while (bVar11);
                    uVar46 = uVar46 + 1;
                    lVar57 = lVar57 + 4;
                    lVar32 = lVar32 + 4;
                    lVar49 = lVar49 + 4;
                    lVar58 = lVar58 + 4;
                  } while (uVar46 != uVar35);
                }
                uVar46 = uVar21 + 2;
                lVar57 = uVar21 + 3;
                lVar27 = lVar27 + local_110;
                lVar51 = lVar51 + local_110;
                lVar39 = lVar39 + local_110;
                lVar44 = lVar44 + local_110;
                uVar21 = uVar46;
                local_100 = lVar36;
              } while (lVar57 < lVar48);
            }
            if ((int)uVar46 < (int)num_input) {
              uVar46 = uVar46 & 0xffffffff;
              lVar51 = lVar50 * uVar46;
              lVar54 = lVar54 + lVar51 + local_108;
              lVar42 = lVar42 + lVar51 + local_108;
              lVar47 = lVar47 + lVar51 + local_108;
              lVar36 = lVar51 + lVar36 + local_108;
              do {
                if (0 < (int)uVar30) {
                  lVar51 = 0;
                  puVar55 = puVar31;
                  do {
                    puVar29 = puVar55;
                    puVar55 = puVar31 + lVar51;
                    *puVar55 = *(undefined4 *)(lVar36 + lVar51);
                    puVar55[1] = *(undefined4 *)(lVar47 + lVar51);
                    puVar55[2] = *(undefined4 *)(lVar42 + lVar51);
                    puVar55[3] = *(undefined4 *)(lVar54 + lVar51);
                    lVar51 = lVar51 + 4;
                    puVar55 = puVar55 + 4;
                  } while (uVar35 * 4 != lVar51);
                  puVar31 = puVar29 + 4;
                }
                uVar46 = uVar46 + 1;
                lVar54 = lVar54 + lVar50;
                lVar42 = lVar42 + lVar50;
                lVar47 = lVar47 + lVar50;
                lVar36 = lVar36 + lVar50;
              } while (uVar46 != uVar38);
            }
            uVar46 = uVar28 + 4;
            uVar21 = uVar28 + 7;
            iVar37 = iVar37 + iVar26;
            iVar25 = iVar25 + iVar26;
            iVar14 = iVar14 + iVar26;
            iVar18 = iVar18 + iVar26;
            uVar28 = uVar46;
            p_Var33 = local_40;
          } while (uVar21 < num_output);
        }
        uVar24 = (uint)uVar46 | 1;
        if ((int)uVar24 < (int)num_output) {
          local_f8 = *(long *)(p_Var33 + 0x160);
          pvVar6 = (this->weight_data_tm).data;
          sVar3 = (this->weight_data_tm).elemsize;
          sVar4 = (this->weight_data_tm).cstep;
          local_f0 = uVar35 * 4;
          lVar50 = local_f8 + (long)(int)(uVar30 * 3) * 4;
          iVar26 = uVar30 * num_input;
          iVar14 = uVar24 * iVar26;
          lVar54 = uVar35 * 0x10;
          lVar36 = local_f8 + (long)(int)(uVar30 * 2) * 4;
          lVar47 = lVar34 * 4;
          lVar42 = local_f8 + lVar34 * 4;
          iVar18 = iVar26 * (uint)uVar46;
          uVar46 = uVar46 & 0xffffffff;
          do {
            local_110 = uVar46;
            lVar27 = (long)iVar14;
            lVar51 = (long)iVar18;
            puVar31 = (undefined4 *)
                      ((ulong)(((uint)(local_110 >> 2) & 0x3fffffff) +
                              (uint)(((uint)local_110 >> 1 & 1) != 0)) * sVar3 * sVar4 +
                      (long)pvVar6);
            if ((int)num_input < 4) {
              uVar46 = 0;
            }
            else {
              local_100 = CONCAT44(local_100._4_4_,iVar14);
              lVar39 = lVar50 + lVar27 * 4;
              lVar44 = lVar36 + lVar27 * 4;
              lVar57 = lVar42 + lVar27 * 4;
              lVar32 = local_f8 + lVar27 * 4;
              lVar49 = lVar50 + lVar51 * 4;
              lVar58 = lVar36 + lVar51 * 4;
              lVar43 = lVar42 + lVar51 * 4;
              lVar40 = local_f8 + lVar51 * 4;
              uVar28 = 0;
              do {
                if (0 < (int)uVar30) {
                  lVar22 = 0;
                  puVar55 = puVar31;
                  do {
                    puVar29 = puVar55;
                    puVar55 = puVar31 + lVar22 * 2;
                    *puVar55 = *(undefined4 *)(lVar40 + lVar22);
                    puVar55[1] = *(undefined4 *)(lVar43 + lVar22);
                    puVar55[2] = *(undefined4 *)(lVar58 + lVar22);
                    puVar55[3] = *(undefined4 *)(lVar49 + lVar22);
                    puVar55[4] = *(undefined4 *)(lVar32 + lVar22);
                    puVar55[5] = *(undefined4 *)(lVar57 + lVar22);
                    puVar55[6] = *(undefined4 *)(lVar44 + lVar22);
                    puVar55[7] = *(undefined4 *)(lVar39 + lVar22);
                    lVar22 = lVar22 + 4;
                    puVar55 = puVar55 + 8;
                  } while (local_f0 != lVar22);
                  puVar31 = puVar29 + 8;
                }
                uVar46 = uVar28 + 4;
                lVar22 = uVar28 + 7;
                lVar39 = lVar39 + lVar54;
                lVar44 = lVar44 + lVar54;
                lVar57 = lVar57 + lVar54;
                lVar32 = lVar32 + lVar54;
                lVar49 = lVar49 + lVar54;
                lVar58 = lVar58 + lVar54;
                lVar43 = lVar43 + lVar54;
                lVar40 = lVar40 + lVar54;
                uVar28 = uVar46;
                local_108 = lVar51;
              } while (lVar22 < lVar48);
            }
            if ((int)((uint)uVar46 | 1) < (int)num_input) {
              lVar39 = lVar47 * (uVar46 & 0xffffffff);
              lVar44 = lVar39 + lVar27 * 4 + local_f8;
              lVar39 = lVar39 + lVar51 * 4 + local_f8;
              uVar28 = uVar46 & 0xffffffff;
              do {
                if (0 < (int)uVar30) {
                  uVar46 = 0;
                  lVar57 = lVar39;
                  lVar32 = lVar44;
                  do {
                    lVar49 = 0;
                    bVar10 = true;
                    do {
                      bVar11 = bVar10;
                      *puVar31 = *(undefined4 *)(lVar57 + lVar49);
                      puVar31[1] = *(undefined4 *)(lVar32 + lVar49);
                      puVar31 = puVar31 + 2;
                      lVar49 = lVar49 + lVar47;
                      bVar10 = false;
                    } while (bVar11);
                    uVar46 = uVar46 + 1;
                    lVar32 = lVar32 + 4;
                    lVar57 = lVar57 + 4;
                  } while (uVar46 != uVar35);
                }
                uVar46 = uVar28 + 2;
                lVar57 = uVar28 + 3;
                lVar44 = lVar44 + lVar34 * 8;
                lVar39 = lVar39 + lVar34 * 8;
                uVar28 = uVar46;
              } while (lVar57 < lVar48);
            }
            if ((int)uVar46 < (int)num_input) {
              uVar46 = uVar46 & 0xffffffff;
              lVar27 = lVar27 * 4 + lVar47 * uVar46 + local_f8;
              lVar51 = lVar47 * uVar46 + lVar51 * 4 + local_f8;
              do {
                if (0 < (int)uVar30) {
                  uVar28 = 0;
                  do {
                    *puVar31 = *(undefined4 *)(lVar51 + uVar28 * 4);
                    puVar31[1] = *(undefined4 *)(lVar27 + uVar28 * 4);
                    puVar31 = puVar31 + 2;
                    uVar28 = uVar28 + 1;
                  } while (uVar35 != uVar28);
                }
                uVar46 = uVar46 + 1;
                lVar27 = lVar27 + lVar47;
                lVar51 = lVar51 + lVar47;
              } while (uVar46 != uVar38);
            }
            uVar46 = local_110 + 2;
            iVar14 = iVar14 + iVar26 * 2;
            iVar18 = iVar18 + iVar26 * 2;
            local_38 = uVar35;
          } while ((long)(local_110 + 3) < (long)(int)num_output);
        }
        if ((int)uVar46 < (int)num_output) {
          lVar36 = *(long *)(local_40 + 0x160);
          pvVar6 = (this->weight_data_tm).data;
          local_f0 = (this->weight_data_tm).elemsize * (this->weight_data_tm).cstep;
          uVar28 = uVar46 & 0xffffffff;
          iVar26 = uVar30 * num_input;
          local_110 = CONCAT44(local_110._4_4_,iVar26);
          iVar18 = (int)uVar46 * iVar26;
          lVar50 = lVar34 * 4;
          do {
            puVar31 = (undefined4 *)
                      ((ulong)(((uint)uVar28 & 1) + ((uint)(uVar28 >> 2) & 0x3fffffff) +
                              (uint)(((uint)uVar28 >> 1 & 1) != 0)) * local_f0 + (long)pvVar6);
            if ((int)num_input < 4) {
              uVar46 = 0;
            }
            else {
              puVar55 = (undefined4 *)(lVar36 + (long)iVar18 * 4);
              uVar21 = 0;
              do {
                if (0 < (int)uVar30) {
                  uVar46 = 0;
                  puVar29 = puVar55;
                  do {
                    puVar41 = puVar31;
                    lVar42 = 0;
                    puVar31 = puVar29;
                    do {
                      *(undefined4 *)((long)puVar41 + lVar42) = *puVar31;
                      lVar42 = lVar42 + 4;
                      puVar31 = puVar31 + lVar34;
                    } while ((int)lVar42 != 0x10);
                    uVar46 = uVar46 + 1;
                    puVar29 = puVar29 + 1;
                    puVar31 = (undefined4 *)(lVar42 + (long)puVar41);
                  } while (uVar46 != uVar35);
                  puVar31 = (undefined4 *)((long)puVar41 + lVar42);
                }
                uVar46 = uVar21 + 4;
                lVar42 = uVar21 + 7;
                puVar55 = puVar55 + uVar35 * 4;
                uVar21 = uVar46;
              } while (lVar42 < lVar48);
            }
            lVar42 = (long)iVar18 * 4;
            if ((int)((uint)uVar46 | 1) < (int)num_input) {
              uVar21 = uVar46 & 0xffffffff;
              lVar54 = (uVar21 * 4 + 4) * lVar34 + lVar36 + lVar42;
              lVar47 = lVar50 * uVar21 + lVar42 + lVar36;
              do {
                if (0 < (int)uVar30) {
                  uVar46 = 0;
                  do {
                    *puVar31 = *(undefined4 *)(lVar47 + uVar46 * 4);
                    puVar31[1] = *(undefined4 *)(lVar54 + uVar46 * 4);
                    puVar31 = puVar31 + 2;
                    uVar46 = uVar46 + 1;
                  } while (uVar35 != uVar46);
                }
                uVar46 = uVar21 + 2;
                lVar51 = uVar21 + 3;
                lVar54 = lVar54 + lVar34 * 8;
                lVar47 = lVar47 + lVar34 * 8;
                uVar21 = uVar46;
              } while (lVar51 < lVar48);
            }
            if ((int)uVar46 < (int)num_input) {
              uVar46 = uVar46 & 0xffffffff;
              lVar42 = lVar50 * uVar46 + lVar42 + lVar36;
              do {
                if (0 < (int)uVar30) {
                  lVar47 = 0;
                  do {
                    *(undefined4 *)((long)puVar31 + lVar47) = *(undefined4 *)(lVar42 + lVar47);
                    lVar47 = lVar47 + 4;
                  } while (uVar35 * 4 - lVar47 != 0);
                  puVar31 = (undefined4 *)((long)puVar31 + lVar47);
                }
                uVar46 = uVar46 + 1;
                lVar42 = lVar42 + lVar50;
              } while (uVar46 != uVar38);
            }
            uVar28 = uVar28 + 1;
            iVar18 = iVar18 + iVar26;
          } while (uVar28 != num_output);
        }
      }
      else {
        if (iVar37 == 2) {
          if (iVar1 != 2) goto LAB_001ace41;
        }
        else if ((iVar37 != 1) || (iVar1 != 1)) goto LAB_001ace41;
        convolution_transform_kernel_packed_sse
                  ((Mat *)(p_Var33 + 0x160),&this->weight_data_tm,num_input,num_output,3,3,1,4);
      }
    }
    if (opt->lightmode != true) {
      return 0;
    }
    p_Var8 = this->_vptr_Convolution_x86[-3];
    p_Var33 = (_func_int *)((long)&this->_vptr_Convolution_x86 + (long)p_Var8);
    p_Var56 = (_func_int *)((long)&(this->weight_winograd63_data).dims + (long)p_Var8);
    piVar2 = *(int **)((long)&(this->weight_winograd63_data).h + (long)p_Var8);
    if (piVar2 == (int *)0x0) goto LAB_001adbfe;
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 != 0) goto LAB_001adbfe;
    pvVar6 = *(void **)(p_Var33 + 0x160);
    plVar7 = *(long **)(p_Var33 + 0x180);
  }
  else {
    if (((((iVar18 != 3) || (iVar26 != 3)) || (opt->use_winograd_convolution == false)) ||
        (((int)uVar30 < 9 && (int)num_input < 9 ||
         (*(int *)((long)&(this->weight_winograd23_data).d + (long)p_Var33) != 1)))) ||
       ((*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var33) != 1 ||
        ((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var33) != 1 ||
         (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var33) != 1))))))
    goto LAB_001ac821;
    lVar34 = *(long *)((long)&(this->weight_sgemm_data).cstep + (long)p_Var33);
    if ((lVar34 == *(long *)((long)&(this->weight_winograd23_data).data + (long)p_Var33)) ||
       ((*(int *)(lVar34 + 0x2c) == 0 || (*(int *)(lVar34 + 0x30) == 0)))) {
      lVar48 = *(long *)((long)&(this->weight_winograd23_data).elemsize + (long)p_Var33);
      lVar50 = *(long *)((long)&(this->weight_winograd23_data).elempack + (long)p_Var33);
      if ((lVar48 != lVar50) && ((*(int *)(lVar48 + 0x2c) != 0 && (*(int *)(lVar48 + 0x30) != 0))))
      goto LAB_001ad588;
      if (((int)uVar30 < 0x21) &&
         ((opt->use_winograd63_convolution != false && ((int)num_input < 0x21)))) {
LAB_001ae1ba:
        conv3x3s1_winograd63_transform_kernel
                  ((Mat *)((long)&(this->weight_winograd63_data).dims + (long)p_Var33),
                   &this->weight_winograd63_data,num_input,uVar30,opt);
      }
      else {
        if (opt->use_winograd43_convolution != true) goto LAB_001adf15;
LAB_001adee1:
        conv3x3s1_winograd43_transform_kernel
                  ((Mat *)((long)&(this->weight_winograd63_data).dims + (long)p_Var33),
                   &this->weight_winograd43_data,num_input,uVar30,opt);
      }
    }
    else {
      lVar48 = *(long *)((long)&(this->weight_winograd23_data).elemsize + (long)p_Var33);
      lVar50 = *(long *)((long)&(this->weight_winograd23_data).elempack + (long)p_Var33);
LAB_001ad588:
      if (((lVar48 == lVar50) || (iVar26 = *(int *)(lVar48 + 0x2c), iVar26 == 0)) ||
         (iVar18 = *(int *)(lVar48 + 0x30), iVar18 == 0)) {
        iVar26 = *(int *)(lVar34 + 0x2c);
        iVar18 = *(int *)(lVar34 + 0x30);
        iVar14 = *(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var33 + 4));
        iVar25 = *(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var33);
        if (((iVar25 < 1 && iVar14 < 1) &&
            (iVar37 = *(int *)((long)&(this->weight_winograd43_data).data + (long)(p_Var33 + 4)),
            iVar37 < 1)) &&
           (iVar1 = *(int *)((long)&(this->weight_winograd43_data).refcount + (long)p_Var33),
           iVar1 < 1)) {
          if ((iVar1 == -0xe9 && (iVar37 == -0xe9 && (iVar25 == -0xe9 && iVar14 == -0xe9))) ||
             (iVar1 == -0xea && (iVar37 == -0xea && (iVar25 == -0xea && iVar14 == -0xea))))
          goto LAB_001ad5a7;
        }
        else {
          iVar26 = iVar14 + iVar26 + iVar25;
          iVar18 = iVar18 + *(int *)((long)&(this->weight_winograd43_data).data +
                                    (long)(p_Var33 + 4)) +
                   *(int *)((long)&(this->weight_winograd43_data).refcount + (long)p_Var33);
        }
      }
      else {
LAB_001ad5a7:
        iVar26 = iVar26 + 2;
        iVar18 = iVar18 + 2;
      }
      bVar10 = test_prefer_winograd63(num_input,uVar30,iVar26,iVar18);
      bVar11 = test_prefer_winograd23(num_input,uVar30,iVar26,iVar18);
      bVar17 = bVar11 & bVar23;
      if (!bVar11) {
        bVar23 = bVar10;
      }
      if (bVar10) {
        bVar12 = opt->use_winograd63_convolution;
        if ((bVar23 & bVar12) == 0) goto LAB_001adec2;
LAB_001ade9b:
        if (bVar17 == 0) {
          if (bVar10) goto LAB_001ae1ba;
          goto LAB_001ae1c5;
        }
      }
      else {
        if (bVar23 != 0) goto LAB_001ade9b;
        bVar12 = 0;
LAB_001adec2:
        if (opt->use_winograd43_convolution == false) {
          if (bVar17 == 0 && opt->use_winograd63_convolution == true) {
            if (bVar12 != 0 || opt->use_winograd63_convolution != false) goto LAB_001ae1ba;
            goto LAB_001ae1c5;
          }
        }
        else if (bVar17 == 0) goto LAB_001adee1;
      }
LAB_001adf15:
      conv3x3s1_winograd23_transform_kernel
                ((Mat *)((long)&(this->weight_winograd63_data).dims + (long)p_Var33),
                 &this->weight_winograd23_data,num_input,uVar30,opt);
    }
LAB_001ae1c5:
    if (opt->lightmode != true) {
      return 0;
    }
    p_Var8 = this->_vptr_Convolution_x86[-3];
    p_Var33 = (_func_int *)((long)&this->_vptr_Convolution_x86 + (long)p_Var8);
    p_Var56 = (_func_int *)((long)&(this->weight_winograd63_data).dims + (long)p_Var8);
    piVar2 = *(int **)((long)&(this->weight_winograd63_data).h + (long)p_Var8);
    if (piVar2 == (int *)0x0) goto LAB_001adbfe;
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 != 0) goto LAB_001adbfe;
    pvVar6 = *(void **)(p_Var33 + 0x160);
    plVar7 = *(long **)(p_Var33 + 0x180);
  }
  if (plVar7 == (long *)0x0) {
    if (pvVar6 != (void *)0x0) {
      free(pvVar6);
    }
  }
  else {
    (**(code **)(*plVar7 + 0x18))();
  }
LAB_001adbfe:
  *(undefined8 *)(p_Var33 + 0x1a0) = 0;
  *(undefined8 *)(p_Var56 + 0xc) = 0;
  *(undefined8 *)(p_Var56 + 0x14) = 0;
  *(undefined8 *)p_Var56 = 0;
  *(undefined8 *)(p_Var56 + 8) = 0;
  *(undefined8 *)(p_Var33 + 0x188) = 0;
  *(undefined8 *)(p_Var33 + 400) = 0;
  *(undefined4 *)(p_Var33 + 0x198) = 0;
  return 0;
}

Assistant:

int Convolution_x86::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    activation = create_activation_layer(activation_type, activation_params, opt);
    nT = opt.num_threads;

#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return create_pipeline_int8_x86(opt);
    }
#endif

    int kernel_size = kernel_w * kernel_h;
    int num_input = weight_data_size / kernel_size / num_output;

    if (!opt.use_packing_layout && kernel_w == kernel_h && dilation_w != 1 && dilation_h == dilation_w && stride_w == 1 && stride_h == 1)
    {
        convolution_dilation1 = ncnn::create_layer(ncnn::LayerType::Convolution);

        // set param
        ncnn::ParamDict pd;
        pd.set(0, num_output); // num_output
        pd.set(1, kernel_w);
        pd.set(11, kernel_h);
        pd.set(2, 1);
        pd.set(12, 1);
        pd.set(3, 1);  // stride_w
        pd.set(13, 1); // stride_h
        pd.set(4, 0);  // pad_w
        pd.set(14, 0); // pad_h
        pd.set(5, bias_term);
        pd.set(6, weight_data_size);

        convolution_dilation1->load_param(pd);

        // set weights
        if (bias_term)
        {
            ncnn::Mat weights[2];
            weights[0] = weight_data;
            weights[1] = bias_data;

            convolution_dilation1->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[1];
            weights[0] = weight_data;

            convolution_dilation1->load_model(ModelBinFromMatArray(weights));
        }

        convolution_dilation1->create_pipeline(opt);

        if (opt.lightmode)
        {
            weight_data.release();
        }

        return 0;
    }

    int elempack = 1;
    int out_elempack = 1;

#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        elempack = num_input % 16 == 0 ? 16 : num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        elempack = num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        elempack = num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    bool prefer_winograd = (opt.use_winograd23_convolution || opt.use_winograd43_convolution || opt.use_winograd63_convolution) && (num_input > 8 || num_output > 8);

    if (opt.use_winograd_convolution && prefer_winograd && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
    {
        if ((bottom_shapes.empty() || bottom_shapes[0].w == 0 || bottom_shapes[0].h == 0) && (top_shapes.empty() || top_shapes[0].w == 0 || top_shapes[0].h == 0))
        {
            // dynamic shape
            if ((opt.use_winograd63_convolution) && (num_input <= 32 && num_output <= 32))
                conv3x3s1_winograd63_transform_kernel(weight_data, weight_winograd63_data, num_input, num_output, opt);
            else if (opt.use_winograd43_convolution)
                conv3x3s1_winograd43_transform_kernel(weight_data, weight_winograd43_data, num_input, num_output, opt);
            else
                conv3x3s1_winograd23_transform_kernel(weight_data, weight_winograd23_data, num_input, num_output, opt);
        }
        else
        {
            int w;
            int h;
            if (top_shapes.empty() || top_shapes[0].w == 0 || top_shapes[0].h == 0)
            {
                w = bottom_shapes[0].w;
                h = bottom_shapes[0].h;

                // make padding
                if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0)
                {
                    w += pad_left + pad_right;
                    h += pad_top + pad_bottom;
                }
                else if ((pad_left == -233 && pad_right == -233 && pad_top == -233 && pad_bottom == -233)
                         || (pad_left == -234 && pad_right == -234 && pad_top == -234 && pad_bottom == -234))
                {
                    // tensorflow padding=SAME or onnx padding=SAME_UPPER/SAME_LOWER
                    w += 2;
                    h += 2;
                }
            }
            else
            {
                w = top_shapes[0].w + 2;
                h = top_shapes[0].h + 2;
            }

            bool prefer_winograd63 = test_prefer_winograd63(num_input, num_output, w, h);
            bool prefer_winograd23 = test_prefer_winograd23(num_input, num_output, w, h);
            bool prefer_winograd43 = !prefer_winograd63 && !prefer_winograd23;

            if (prefer_winograd23 && !opt.use_winograd23_convolution)
            {
                // f23 fallback to f43
                prefer_winograd23 = false;
                prefer_winograd43 = true;
            }

            if (prefer_winograd63 && !opt.use_winograd63_convolution)
            {
                // f63 fallback to f43
                prefer_winograd63 = false;
                prefer_winograd43 = true;
            }

            if (prefer_winograd43 && !opt.use_winograd43_convolution)
            {
                // f43 fallback to f63 or f23
                prefer_winograd43 = false;
                if (opt.use_winograd63_convolution)
                {
                    prefer_winograd63 = true;
                }
                else
                {
                    prefer_winograd23 = true;
                }
            }

            if (prefer_winograd23)
            {
                conv3x3s1_winograd23_transform_kernel(weight_data, weight_winograd23_data, num_input, num_output, opt);
            }
            else if (prefer_winograd43)
            {
                conv3x3s1_winograd43_transform_kernel(weight_data, weight_winograd43_data, num_input, num_output, opt);
            }
            else if (prefer_winograd63)
            {
                conv3x3s1_winograd63_transform_kernel(weight_data, weight_winograd63_data, num_input, num_output, opt);
            }
            else
            {
                // should never reach here
            }
        }

        if (opt.lightmode)
        {
            weight_data.release();
        }

        return 0;
    }

    int l2_cache_size = get_cpu_level2_cache_size();
    bool prefer_sgemm = num_input * num_output * kernel_w * kernel_h * dilation_w * dilation_h * stride_w * stride_h * (int)sizeof(float) * 2 > l2_cache_size || (num_input > 16 || num_output > 16);

    if ((opt.use_sgemm_convolution && prefer_sgemm) || (kernel_w == 1 && kernel_h == 1))
    {
        const int maxk = kernel_w * kernel_h;

        gemm = ncnn::create_layer(ncnn::LayerType::Gemm);

        ncnn::ParamDict pd;
        pd.set(2, 0);                   // transA
        pd.set(3, 0);                   // transB
        pd.set(4, 1);                   // constantA
        pd.set(5, 0);                   // constantB
        pd.set(6, 1);                   // constantC
        pd.set(7, num_output);          // M = outch
        pd.set(8, 0);                   // N = size
        pd.set(9, maxk * num_input);    // K = maxk*inch
        pd.set(10, bias_term ? 1 : -1); // constant_broadcast_type_C = (M)
        pd.set(11, 1);                  // output_N1M

        gemm->load_param(pd);

        // maxk-inch-outch to pa-maxk-inch/pa-outch
        Mat tmp;
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, num_input, num_output);

            tmp.create(maxk * num_input, num_output);

            for (int q = 0; q < num_output; q += 1)
            {
                float* g00 = tmp.row(q);

                for (int p = 0; p + (elempack - 1) < num_input; p += elempack)
                {
                    for (int k = 0; k < maxk; k++)
                    {
                        for (int i = 0; i < elempack; i++)
                        {
                            const float* k00 = weight_data_r2.channel(q).row(p + i);
                            g00[0] = k00[k];
                            g00++;
                        }
                    }
                }
            }
        }

        if (bias_term)
        {
            ncnn::Mat weights[2];
            weights[0] = tmp;
            weights[1] = bias_data;

            gemm->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[1];
            weights[0] = tmp;

            gemm->load_model(ModelBinFromMatArray(weights));
        }

        gemm->create_pipeline(opt);
    }
    else
    {
        if ((elempack == 16 && out_elempack == 1 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
                || (elempack == 8 && out_elempack == 8 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
                || (elempack == 8 && out_elempack == 8 && kernel_w == 2 && kernel_h == 2 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
                || (elempack == 1 && out_elempack == 8 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
                || (elempack == 1 && out_elempack == 8 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
                || (elempack == 8 && out_elempack == 1 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
                || (elempack == 1 && out_elempack == 4 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
                || (elempack == 1 && out_elempack == 4 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2))
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
        else
        {
            convolution_transform_kernel_packed(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h);
        }
    }

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}